

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpge.cpp
# Opt level: O3

void __thiscall jpge::jpeg_encoder::code_coefficients_pass_one(jpeg_encoder *this,int component_num)

{
  uint32 *puVar1;
  short sVar2;
  ushort uVar3;
  ulong uVar4;
  uint32 (*pauVar5) [256];
  long lVar6;
  ushort uVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  bool bVar12;
  
  if (component_num < 3) {
    uVar4 = (ulong)(component_num != 0);
    sVar2 = this->m_coefficient_array[0];
    iVar10 = this->m_last_dc_val[component_num];
    this->m_last_dc_val[component_num] = (int)sVar2;
    uVar8 = sVar2 - iVar10;
    if (uVar8 == 0) {
      lVar6 = 0;
    }
    else {
      uVar11 = -uVar8;
      if (0 < (int)uVar8) {
        uVar11 = uVar8;
      }
      lVar6 = 0;
      uVar9 = (ulong)uVar11;
      do {
        uVar9 = uVar9 >> 1;
        lVar6 = lVar6 + 1;
        bVar12 = 1 < uVar11;
        uVar11 = (uint)uVar9;
      } while (bVar12);
    }
    puVar1 = this->m_huff_count[uVar4] + lVar6;
    *puVar1 = *puVar1 + 1;
    pauVar5 = this->m_huff_count + uVar4 + 2;
    lVar6 = 1;
    uVar8 = 0;
    do {
      while (uVar3 = this->m_coefficient_array[lVar6], uVar3 == 0) {
        uVar8 = uVar8 + 1;
        lVar6 = lVar6 + 1;
        if (lVar6 == 0x40) {
          if (uVar8 == 0) {
            return;
          }
          (*pauVar5)[0] = (*pauVar5)[0] + 1;
          return;
        }
      }
      if (0xf < (int)uVar8) {
        iVar10 = uVar8 - 0x1f;
        if (uVar8 < 0x1f) {
          iVar10 = 0;
        }
        uVar8 = (uVar8 - (iVar10 + 0xfU & 0xfffffff0)) - 0x10;
        this->m_huff_count[uVar4 + 2][0xf0] =
             this->m_huff_count[uVar4 + 2][0xf0] + (iVar10 + 0xfU >> 4) + 1;
      }
      uVar7 = -uVar3;
      if (0 < (short)uVar3) {
        uVar7 = uVar3;
      }
      iVar10 = 1;
      if (1 < uVar7) {
        uVar11 = (uint)uVar7;
        do {
          iVar10 = iVar10 + 1;
          bVar12 = 3 < uVar11;
          uVar11 = uVar11 >> 1;
        } while (bVar12);
      }
      (*pauVar5)[(int)(uVar8 * 0x10 + iVar10)] = (*pauVar5)[(int)(uVar8 * 0x10 + iVar10)] + 1;
      lVar6 = lVar6 + 1;
      uVar8 = 0;
    } while (lVar6 != 0x40);
  }
  return;
}

Assistant:

void jpeg_encoder::code_coefficients_pass_one(int component_num)
{
  if (component_num >= 3) return; // just to shut up static analysis
  int i, run_len, nbits, temp1;
  int16 *src = m_coefficient_array;
  uint32 *dc_count = component_num ? m_huff_count[0 + 1] : m_huff_count[0 + 0], *ac_count = component_num ? m_huff_count[2 + 1] : m_huff_count[2 + 0];

  temp1 = src[0] - m_last_dc_val[component_num];
  m_last_dc_val[component_num] = src[0];
  if (temp1 < 0) temp1 = -temp1;

  nbits = 0;
  while (temp1)
  {
    nbits++; temp1 >>= 1;
  }

  dc_count[nbits]++;
  for (run_len = 0, i = 1; i < 64; i++)
  {
    if ((temp1 = m_coefficient_array[i]) == 0)
      run_len++;
    else
    {
      while (run_len >= 16)
      {
        ac_count[0xF0]++;
        run_len -= 16;
      }
      if (temp1 < 0) temp1 = -temp1;
      nbits = 1;
      while (temp1 >>= 1) nbits++;
      ac_count[(run_len << 4) + nbits]++;
      run_len = 0;
    }
  }
  if (run_len) ac_count[0]++;
}